

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_rnglists.c
# Opt level: O0

int dwarf_get_rnglist_offset_index_value
              (Dwarf_Debug dbg,Dwarf_Unsigned context_index,Dwarf_Unsigned offsetentry_index,
              Dwarf_Unsigned *offset_value_out,Dwarf_Unsigned *global_offset_value_out,
              Dwarf_Error *error)

{
  Dwarf_Rnglists_Context pDVar1;
  uint uVar2;
  Dwarf_Small *pDVar3;
  char *msg;
  Dwarf_Byte_Ptr readend;
  Dwarf_Unsigned _ltmp;
  dwarfstring m;
  Dwarf_Unsigned localoffset;
  Dwarf_Unsigned targetoffset;
  Dwarf_Small *offsetptr;
  uint offset_len;
  Dwarf_Rnglists_Context con;
  Dwarf_Error *error_local;
  Dwarf_Unsigned *global_offset_value_out_local;
  Dwarf_Unsigned *offset_value_out_local;
  Dwarf_Unsigned offsetentry_index_local;
  Dwarf_Unsigned context_index_local;
  Dwarf_Debug dbg_local;
  
  m.s_malloc = '\0';
  m._25_7_ = 0;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_get_rnglist_offset_index_value()either null or it containsa stale Dwarf_Debug pointer"
                       );
    dbg_local._4_4_ = 1;
  }
  else if (dbg->de_rnglists_context == (Dwarf_Rnglists_Context *)0x0) {
    dbg_local._4_4_ = -1;
  }
  else if (dbg->de_rnglists_context_count == 0) {
    dbg_local._4_4_ = -1;
  }
  else if (context_index < dbg->de_rnglists_context_count) {
    pDVar1 = dbg->de_rnglists_context[context_index];
    if (pDVar1->rc_magic == 0xabcd) {
      if (offsetentry_index < pDVar1->rc_offset_entry_count) {
        uVar2 = (uint)pDVar1->rc_offset_size;
        m._24_8_ = offsetentry_index * uVar2;
        pDVar3 = pDVar1->rc_offsets_array + m._24_8_;
        if (pDVar1->rc_past_last_rnglist_offset <
            pDVar1->rc_offsets_off_in_sect + m._24_8_ + (ulong)uVar2) {
          dwarfstring_constructor((dwarfstring_s *)&_ltmp);
          dwarfstring_append_printf_u
                    ((dwarfstring *)&_ltmp,
                     "DW_DLE_RNGLISTS_ERROR dwarf_get_rnglist_offset_index_value()  Offset for index %u is too large. "
                     ,offsetentry_index);
          msg = dwarfstring_string((dwarfstring_s *)&_ltmp);
          _dwarf_error_string(dbg,error,0x1d4,msg);
          dwarfstring_destructor((dwarfstring_s *)&_ltmp);
          dbg_local._4_4_ = 1;
        }
        else {
          readend = (Dwarf_Byte_Ptr)0x0;
          if (pDVar3 + uVar2 < pDVar3) {
            _dwarf_error_string(dbg,error,0x14b,
                                "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section"
                               );
            dbg_local._4_4_ = 1;
          }
          else if (pDVar1->rc_endaddr < pDVar3 + uVar2) {
            _dwarf_error_string(dbg,error,0x14b,
                                "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section"
                               );
            dbg_local._4_4_ = 1;
          }
          else {
            (*dbg->de_copy_word)(&readend,pDVar3,(ulong)pDVar1->rc_offset_size);
            if (offset_value_out != (Dwarf_Unsigned *)0x0) {
              *offset_value_out = (Dwarf_Unsigned)readend;
            }
            if (global_offset_value_out != (Dwarf_Unsigned *)0x0) {
              *global_offset_value_out = (Dwarf_Unsigned)(readend + pDVar1->rc_offsets_off_in_sect);
            }
            dbg_local._4_4_ = 0;
          }
        }
      }
      else {
        dbg_local._4_4_ = -1;
      }
    }
    else {
      _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                          "DW_DLE_DBG_NULL rnglists context magic wrong not RNGLISTS_MAGIC");
      dbg_local._4_4_ = 1;
    }
  }
  else {
    dbg_local._4_4_ = -1;
  }
  return dbg_local._4_4_;
}

Assistant:

int
dwarf_get_rnglist_offset_index_value(
    Dwarf_Debug dbg,
    Dwarf_Unsigned context_index,
    Dwarf_Unsigned offsetentry_index,
    Dwarf_Unsigned * offset_value_out,
    Dwarf_Unsigned * global_offset_value_out,
    Dwarf_Error *error)
{
    Dwarf_Rnglists_Context con = 0;
    unsigned offset_len = 0;
    Dwarf_Small *offsetptr = 0;
    Dwarf_Unsigned targetoffset = 0;
    Dwarf_Unsigned localoffset = 0;

    CHECK_DBG(dbg,error,"dwarf_get_rnglist_offset_index_value()");
    if (!dbg->de_rnglists_context) {
        return DW_DLV_NO_ENTRY;
    }

    if (!dbg->de_rnglists_context_count) {
        return DW_DLV_NO_ENTRY;
    }
    if (context_index >= dbg->de_rnglists_context_count) {
        return DW_DLV_NO_ENTRY;
    }
    con = dbg->de_rnglists_context[context_index];
    if (con->rc_magic != RNGLISTS_MAGIC) {
        _dwarf_error_string(NULL, error,DW_DLE_DBG_NULL,
            "DW_DLE_DBG_NULL "
            "rnglists context magic wrong "
            "not RNGLISTS_MAGIC");
        return DW_DLV_ERROR;
    }
    if (offsetentry_index >= con->rc_offset_entry_count) {
        return DW_DLV_NO_ENTRY;
    }
    offset_len  = con->rc_offset_size;
    localoffset = offsetentry_index*offset_len;
    offsetptr   = con->rc_offsets_array + localoffset;
    if ((con->rc_offsets_off_in_sect +localoffset +
        offset_len) >
        con->rc_past_last_rnglist_offset) {
        dwarfstring m;

        dwarfstring_constructor(&m);
        dwarfstring_append_printf_u(&m,
            "DW_DLE_RNGLISTS_ERROR "
            "dwarf_get_rnglist_offset_index_value() "
            " Offset for index %u is too large. ",
            offsetentry_index);
        _dwarf_error_string(dbg, error,DW_DLE_RNGLISTS_ERROR,
            dwarfstring_string(&m));
        dwarfstring_destructor(&m);
        return DW_DLV_ERROR;

    }
    READ_UNALIGNED_CK(dbg,targetoffset,Dwarf_Unsigned,
        offsetptr,
        offset_len,error,con->rc_endaddr);
    if (offset_value_out) {
        *offset_value_out = targetoffset;
    }
    if (global_offset_value_out) {
        *global_offset_value_out = targetoffset +
            con->rc_offsets_off_in_sect;
    }
    return DW_DLV_OK;
}